

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_reader.cpp
# Opt level: O1

shared_ptr<duckdb::ParquetFileMetadataCache,_true> __thiscall
duckdb::LoadMetadata
          (duckdb *this,ClientContext *context,Allocator *allocator,CachingFileHandle *file_handle,
          shared_ptr<const_duckdb::ParquetEncryptionConfig,_true> *encryption_config,
          EncryptionUtil *encryption_util,optional_idx footer_size)

{
  ThriftFileTransport *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  ulong file_size;
  long lVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  _Alloc_hider _Var4;
  element_type *peVar5;
  bool bVar6;
  long lVar7;
  pointer pTVar8;
  idx_t iVar9;
  undefined1 *extraout_RAX;
  uint64_t len;
  FileMetaData *this_02;
  FileCryptoMetaData *this_03;
  pointer pFVar10;
  type pFVar11;
  type iprot;
  ParquetEncryptionConfig *this_04;
  string *key;
  pointer pFVar12;
  _Tuple_impl<0UL,_const_duckdb_parquet::FileMetaData_*,_std::default_delete<const_duckdb_parquet::FileMetaData>_>
  this_05;
  InvalidInputException *pIVar13;
  size_t __nbytes;
  _List_node_base *p_Var14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var15;
  ulong uVar16;
  int iVar17;
  iterator __end2;
  shared_ptr<duckdb::ParquetFileMetadataCache,_true> sVar18;
  bool footer_encrypted;
  uint32_t read_footer_len;
  unique_ptr<duckdb_apache::thrift::protocol::TProtocol,_std::default_delete<duckdb_apache::thrift::protocol::TProtocol>,_true>
  file_proto;
  unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>,_true>
  geo_metadata;
  templated_unique_single_t metadata;
  bool local_119;
  _Head_base<0UL,_duckdb_parquet::FileCryptoMetaData_*,_false> local_118;
  _Head_base<0UL,_duckdb_apache::thrift::protocol::TProtocol_*,_false> local_110;
  undefined1 local_108 [40];
  _Alloc_hider local_e0;
  undefined1 local_d0 [8];
  string local_c8;
  undefined8 local_a8;
  EncryptionUtil *local_a0;
  element_type *local_98;
  string local_90;
  string local_70;
  string local_50;
  
  local_d0 = (undefined1  [8])encryption_config;
  local_a8 = context;
  local_a0 = encryption_util;
  local_98 = (element_type *)this;
  lVar7 = ::std::chrono::_V2::system_clock::now();
  __nbytes = 0x112e0be826d694b3;
  CreateThriftFileProtocol((duckdb *)&local_110,file_handle,false);
  pTVar8 = unique_ptr<duckdb_apache::thrift::protocol::TProtocol,_std::default_delete<duckdb_apache::thrift::protocol::TProtocol>,_true>
           ::operator->((unique_ptr<duckdb_apache::thrift::protocol::TProtocol,_std::default_delete<duckdb_apache::thrift::protocol::TProtocol>,_true>
                         *)&local_110);
  this_00 = (ThriftFileTransport *)
            (pTVar8->ptrans_).
            super___shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  this_01 = (pTVar8->ptrans_).
            super___shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
    }
  }
  file_size = this_00->size;
  if (file_size < 0xc) {
    pIVar13 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    local_108._0_8_ = local_108 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_108,"File \'%s\' too small to be a Parquet file","");
    CachingFileHandle::GetPath_abi_cxx11_(&local_50,file_handle);
    InvalidInputException::InvalidInputException<std::__cxx11::string>
              (pIVar13,(string *)local_108,&local_50);
    __cxa_throw(pIVar13,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (footer_size.index == 0xffffffffffffffff) {
    bVar6 = ShouldAndCanPrefetch((ClientContext *)local_a8,file_handle);
    len = 8;
    if (bVar6) {
      __nbytes = 0x20c49ba5e353f7cf;
      uVar16 = 0x4000;
      if (0x4000 < file_size / 1000) {
        uVar16 = file_size / 1000;
      }
      if (0x3ffff < uVar16) {
        uVar16 = 0x40000;
      }
      len = NextPowerOfTwo(uVar16);
      if (file_size <= len) {
        len = file_size;
      }
    }
    local_108._0_8_ = (data_ptr_t)0x0;
    local_108._8_8_ = 0;
    AllocatedData::AllocatedData((AllocatedData *)(local_108 + 0x10));
    local_e0._M_p = (pointer)0x0;
    ResizeableBuffer::resize((ResizeableBuffer *)local_108,allocator,8);
    switchD_0130b471::default((void *)local_108._0_8_,0,local_108._8_8_);
    ThriftFileTransport::Prefetch(this_00,file_size - len,len);
    this_00->location = file_size - 8;
    ThriftFileTransport::read(this_00,(int)local_108._0_8_,(void *)0x8,__nbytes);
    uVar2 = local_108._0_8_;
    CachingFileHandle::GetPath_abi_cxx11_((string *)(local_d0 + 8),file_handle);
    ParseParquetFooter((data_ptr_t)uVar2,(string *)(local_d0 + 8),file_size,
                       (shared_ptr<const_duckdb::ParquetEncryptionConfig,_true> *)local_d0,
                       (uint32_t *)&local_118,&local_119);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p);
    }
    iVar9 = file_size - ((int)local_118._M_head_impl + 8);
    this_00->location = iVar9;
    if (len - 8 < ((ulong)local_118._M_head_impl & 0xffffffff)) {
      ThriftFileTransport::Prefetch(this_00,iVar9,(ulong)local_118._M_head_impl & 0xffffffff);
    }
    AllocatedData::~AllocatedData((AllocatedData *)(local_108 + 0x10));
  }
  else {
    iVar9 = optional_idx::GetIndex(&footer_size);
    iVar17 = (int)iVar9;
    if ((iVar17 == 0) || (file_size < iVar17 + 0xc)) {
      pIVar13 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      local_108._0_8_ = local_108 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_108,"Invalid footer length provided for file \'%s\'","");
      CachingFileHandle::GetPath_abi_cxx11_(&local_70,file_handle);
      InvalidInputException::InvalidInputException<std::__cxx11::string>
                (pIVar13,(string *)local_108,&local_70);
      __cxa_throw(pIVar13,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    uVar16 = file_size - (iVar17 + 8);
    this_00->location = uVar16;
    ThriftFileTransport::Prefetch(this_00,uVar16,(ulong)(iVar17 + 8));
    local_c8._M_dataplus._M_p = extraout_RAX;
    p_Var14 = (_List_node_base *)&this_00->ra_buffer;
    do {
      p_Var14 = (((list<duckdb::ReadHead,_std::allocator<duckdb::ReadHead>_> *)&p_Var14->_M_next)->
                super__List_base<duckdb::ReadHead,_std::allocator<duckdb::ReadHead>_>)._M_impl.
                _M_node.super__List_node_base._M_next;
      if ((ReadAheadBuffer *)p_Var14 == &this_00->ra_buffer) {
        local_c8._M_dataplus._M_p = (undefined1 *)0x0;
        break;
      }
      if ((uVar16 < *(ulong *)(p_Var14 + 1)) ||
         (*(ulong *)(p_Var14 + 1) + (long)p_Var14[1]._M_prev <= uVar16)) {
        bVar6 = true;
      }
      else {
        local_c8._M_dataplus._M_p = (pointer)(p_Var14 + 1);
        bVar6 = false;
      }
    } while (bVar6);
    optional_ptr<duckdb::ReadHead,_true>::CheckValid
              ((optional_ptr<duckdb::ReadHead,_true> *)(local_d0 + 8));
    lVar1 = *(long *)((long)local_c8._M_dataplus._M_p + 0x28);
    CachingFileHandle::GetPath_abi_cxx11_((string *)local_108,file_handle);
    ParseParquetFooter((data_ptr_t)(lVar1 + (iVar9 & 0xffffffff)),(string *)local_108,file_size,
                       (shared_ptr<const_duckdb::ParquetEncryptionConfig,_true> *)local_d0,
                       (uint32_t *)&local_118,&local_119);
    if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
      operator_delete((void *)local_108._0_8_);
    }
    if ((int)local_118._M_head_impl != iVar17) {
      pIVar13 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      local_108._0_8_ = local_108 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_108,
                 "Parquet footer length stored in file is not equal to footer length provided","");
      InvalidInputException::InvalidInputException(pIVar13,(string *)local_108);
      __cxa_throw(pIVar13,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  this_02 = (FileMetaData *)operator_new(0x170);
  duckdb_parquet::FileMetaData::FileMetaData(this_02);
  local_c8._M_dataplus._M_p = (pointer)this_02;
  if (local_119 == true) {
    this_03 = (FileCryptoMetaData *)operator_new(0xe0);
    duckdb_parquet::FileCryptoMetaData::FileCryptoMetaData(this_03);
    local_118._M_head_impl = this_03;
    pFVar10 = unique_ptr<duckdb_parquet::FileCryptoMetaData,_std::default_delete<duckdb_parquet::FileCryptoMetaData>,_true>
              ::operator->((unique_ptr<duckdb_parquet::FileCryptoMetaData,_std::default_delete<duckdb_parquet::FileCryptoMetaData>,_true>
                            *)&local_118);
    (**(code **)(*(long *)pFVar10 + 0x10))(pFVar10,local_110._M_head_impl);
    pFVar10 = unique_ptr<duckdb_parquet::FileCryptoMetaData,_std::default_delete<duckdb_parquet::FileCryptoMetaData>,_true>
              ::operator->((unique_ptr<duckdb_parquet::FileCryptoMetaData,_std::default_delete<duckdb_parquet::FileCryptoMetaData>,_true>
                            *)&local_118);
    if (((byte)(pFVar10->encryption_algorithm).__isset & 2) != 0) {
      pIVar13 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      local_108._0_8_ = local_108 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_108,
                 "File \'%s\' is encrypted with AES_GCM_CTR_V1, but only AES_GCM_V1 is supported",""
                );
      CachingFileHandle::GetPath_abi_cxx11_(&local_90,file_handle);
      InvalidInputException::InvalidInputException<std::__cxx11::string>
                (pIVar13,(string *)local_108,&local_90);
      __cxa_throw(pIVar13,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pFVar11 = unique_ptr<duckdb_parquet::FileMetaData,_std::default_delete<duckdb_parquet::FileMetaData>,_true>
              ::operator*((unique_ptr<duckdb_parquet::FileMetaData,_std::default_delete<duckdb_parquet::FileMetaData>,_true>
                           *)(local_d0 + 8));
    lVar1 = *(long *)(*(long *)pFVar11 + -0x30);
    iprot = unique_ptr<duckdb_apache::thrift::protocol::TProtocol,_std::default_delete<duckdb_apache::thrift::protocol::TProtocol>,_true>
            ::operator*((unique_ptr<duckdb_apache::thrift::protocol::TProtocol,_std::default_delete<duckdb_apache::thrift::protocol::TProtocol>,_true>
                         *)&local_110);
    this_04 = shared_ptr<const_duckdb::ParquetEncryptionConfig,_true>::operator->
                        ((shared_ptr<const_duckdb::ParquetEncryptionConfig,_true> *)local_d0);
    key = ParquetEncryptionConfig::GetFooterKey_abi_cxx11_(this_04);
    ParquetCrypto::Read((TBase *)(&pFVar11->field_0x0 + lVar1),iprot,key,local_a0);
    if (local_118._M_head_impl != (FileCryptoMetaData *)0x0) {
      (**(code **)(*(long *)local_118._M_head_impl + 8))();
    }
  }
  else {
    pFVar12 = unique_ptr<duckdb_parquet::FileMetaData,_std::default_delete<duckdb_parquet::FileMetaData>,_true>
              ::operator->((unique_ptr<duckdb_parquet::FileMetaData,_std::default_delete<duckdb_parquet::FileMetaData>,_true>
                            *)(local_d0 + 8));
    (**(code **)(*(long *)pFVar12 + 0x10))(pFVar12,local_110._M_head_impl);
  }
  pFVar11 = unique_ptr<duckdb_parquet::FileMetaData,_std::default_delete<duckdb_parquet::FileMetaData>,_true>
            ::operator*((unique_ptr<duckdb_parquet::FileMetaData,_std::default_delete<duckdb_parquet::FileMetaData>,_true>
                         *)(local_d0 + 8));
  GeoParquetFileMetadata::TryRead
            ((GeoParquetFileMetadata *)local_108,pFVar11,(ClientContext *)local_a8);
  this_05.super__Head_base<0UL,_const_duckdb_parquet::FileMetaData_*,_false>._M_head_impl =
       (_Head_base<0UL,_const_duckdb_parquet::FileMetaData_*,_false>)operator_new(0x30);
  peVar5 = local_98;
  _Var4._M_p = local_c8._M_dataplus._M_p;
  uVar2 = local_108._0_8_;
  *(undefined8 *)
   ((long)this_05.super__Head_base<0UL,_const_duckdb_parquet::FileMetaData_*,_false>._M_head_impl +
   8) = 0x100000001;
  *(undefined ***)
   this_05.super__Head_base<0UL,_const_duckdb_parquet::FileMetaData_*,_false>._M_head_impl =
       &PTR___Sp_counted_ptr_inplace_024c63e0;
  local_c8._M_dataplus._M_p = (pointer)0x0;
  local_108._0_8_ = (GeoParquetFileMetadata *)0x0;
  uVar3 = local_108._0_8_;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
  ((long)this_05.super__Head_base<0UL,_const_duckdb_parquet::FileMetaData_*,_false>._M_head_impl +
  0x10))->_vptr__Sp_counted_base = (_func_int **)&PTR__ParquetFileMetadataCache_024c6430;
  *(pointer *)
   &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
    ((long)this_05.super__Head_base<0UL,_const_duckdb_parquet::FileMetaData_*,_false>._M_head_impl +
    0x10))->_M_use_count = _Var4._M_p;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
  ((long)this_05.super__Head_base<0UL,_const_duckdb_parquet::FileMetaData_*,_false>._M_head_impl +
  0x20))->_vptr__Sp_counted_base = (_func_int **)(lVar7 / 1000000000);
  local_108._0_4_ = (undefined4)uVar2;
  local_108._4_4_ = SUB84(uVar2,4);
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
  ((long)this_05.super__Head_base<0UL,_const_duckdb_parquet::FileMetaData_*,_false>._M_head_impl +
  0x20))->_M_use_count = local_108._0_4_;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
  ((long)this_05.super__Head_base<0UL,_const_duckdb_parquet::FileMetaData_*,_false>._M_head_impl +
  0x20))->_M_weak_count = local_108._4_4_;
  (local_98->super_ObjectCacheEntry)._vptr_ObjectCacheEntry =
       (_func_int **)
       ((long)this_05.super__Head_base<0UL,_const_duckdb_parquet::FileMetaData_*,_false>.
              _M_head_impl + 0x10);
  (local_98->metadata).
  super_unique_ptr<const_duckdb_parquet::FileMetaData,_std::default_delete<const_duckdb_parquet::FileMetaData>_>
  ._M_t.
  super___uniq_ptr_impl<const_duckdb_parquet::FileMetaData,_std::default_delete<const_duckdb_parquet::FileMetaData>_>
  ._M_t.
  super__Tuple_impl<0UL,_const_duckdb_parquet::FileMetaData_*,_std::default_delete<const_duckdb_parquet::FileMetaData>_>
  .super__Head_base<0UL,_const_duckdb_parquet::FileMetaData_*,_false> =
       this_05.super__Head_base<0UL,_const_duckdb_parquet::FileMetaData_*,_false>._M_head_impl;
  if (__libc_single_threaded == '\0') {
    LOCK();
    *(_Atomic_word *)
     ((long)this_05.super__Head_base<0UL,_const_duckdb_parquet::FileMetaData_*,_false>._M_head_impl
     + 8) = *(_Atomic_word *)
             ((long)this_05.super__Head_base<0UL,_const_duckdb_parquet::FileMetaData_*,_false>.
                    _M_head_impl + 8) + 1;
    UNLOCK();
  }
  else {
    *(_Atomic_word *)
     ((long)this_05.super__Head_base<0UL,_const_duckdb_parquet::FileMetaData_*,_false>._M_head_impl
     + 8) = 2;
  }
  local_108._0_8_ = uVar3;
  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             this_05.super__Head_base<0UL,_const_duckdb_parquet::FileMetaData_*,_false>._M_head_impl
            );
  _Var15._M_pi = extraout_RDX;
  if ((GeoParquetFileMetadata *)local_108._0_8_ != (GeoParquetFileMetadata *)0x0) {
    ::std::default_delete<duckdb::GeoParquetFileMetadata>::operator()
              ((default_delete<duckdb::GeoParquetFileMetadata> *)local_108,
               (GeoParquetFileMetadata *)local_108._0_8_);
    _Var15._M_pi = extraout_RDX_00;
  }
  if ((long *)local_c8._M_dataplus._M_p != (long *)0x0) {
    (**(code **)(*(long *)local_c8._M_dataplus._M_p + 8))();
    _Var15._M_pi = extraout_RDX_01;
  }
  if (local_110._M_head_impl != (TProtocol *)0x0) {
    (*(local_110._M_head_impl)->_vptr_TProtocol[1])();
    _Var15._M_pi = extraout_RDX_02;
  }
  sVar18.internal.super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var15._M_pi;
  sVar18.internal.super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = peVar5;
  return (shared_ptr<duckdb::ParquetFileMetadataCache,_true>)
         sVar18.internal.
         super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static shared_ptr<ParquetFileMetadataCache>
LoadMetadata(ClientContext &context, Allocator &allocator, CachingFileHandle &file_handle,
             const shared_ptr<const ParquetEncryptionConfig> &encryption_config, const EncryptionUtil &encryption_util,
             optional_idx footer_size) {
	auto current_time = std::chrono::system_clock::to_time_t(std::chrono::system_clock::now());

	auto file_proto = CreateThriftFileProtocol(file_handle, false);
	auto &transport = reinterpret_cast<ThriftFileTransport &>(*file_proto->getTransport());
	auto file_size = transport.GetSize();
	if (file_size < 12) {
		throw InvalidInputException("File '%s' too small to be a Parquet file", file_handle.GetPath());
	}

	bool footer_encrypted;
	// footer size is not provided - read it from the back
	if (!footer_size.IsValid()) {
		// We have to do two reads here:
		// 1. The 8 bytes from the back to check if it's a Parquet file and the footer size
		// 2. The footer (after getting the size)
		// For local reads this doesn't matter much, but for remote reads this means two round trips,
		// which is especially bad for small Parquet files where the read cost is mostly round trips.
		// So, we prefetch more, to hopefully save a round trip.
		static constexpr idx_t ESTIMATED_FOOTER_RATIO = 1000; // Estimate 1/1000th of the file to be footer
		static constexpr idx_t MIN_PREFETCH_SIZE = 16384;     // Prefetch at least this many bytes
		static constexpr idx_t MAX_PREFETCH_SIZE = 262144;    // Prefetch at most this many bytes
		idx_t prefetch_size = 8;
		if (ShouldAndCanPrefetch(context, file_handle)) {
			prefetch_size = ClampValue(file_size / ESTIMATED_FOOTER_RATIO, MIN_PREFETCH_SIZE, MAX_PREFETCH_SIZE);
			prefetch_size = MinValue(NextPowerOfTwo(prefetch_size), file_size);
		}

		ResizeableBuffer buf;
		buf.resize(allocator, 8);
		buf.zero();

		transport.Prefetch(file_size - prefetch_size, prefetch_size);
		transport.SetLocation(file_size - 8);
		transport.read(buf.ptr, 8);

		uint32_t footer_len;
		ParseParquetFooter(buf.ptr, file_handle.GetPath(), file_size, encryption_config, footer_len, footer_encrypted);

		auto metadata_pos = file_size - (footer_len + 8);
		transport.SetLocation(metadata_pos);
		if (footer_len > prefetch_size - 8) {
			transport.Prefetch(metadata_pos, footer_len);
		}
	} else {
		auto footer_len = UnsafeNumericCast<uint32_t>(footer_size.GetIndex());
		if (footer_len == 0 || file_size < 12 + footer_len) {
			throw InvalidInputException("Invalid footer length provided for file '%s'", file_handle.GetPath());
		}

		idx_t total_footer_len = footer_len + 8;
		auto metadata_pos = file_size - total_footer_len;
		transport.SetLocation(metadata_pos);
		transport.Prefetch(metadata_pos, total_footer_len);

		auto read_head = transport.GetReadHead(metadata_pos);
		auto data_ptr = read_head->buffer_ptr;

		uint32_t read_footer_len;
		ParseParquetFooter(data_ptr + footer_len, file_handle.GetPath(), file_size, encryption_config, read_footer_len,
		                   footer_encrypted);
		if (read_footer_len != footer_len) {
			throw InvalidInputException("Parquet footer length stored in file is not equal to footer length provided");
		}
	}

	auto metadata = make_uniq<FileMetaData>();
	if (footer_encrypted) {
		auto crypto_metadata = make_uniq<FileCryptoMetaData>();
		crypto_metadata->read(file_proto.get());
		if (crypto_metadata->encryption_algorithm.__isset.AES_GCM_CTR_V1) {
			throw InvalidInputException("File '%s' is encrypted with AES_GCM_CTR_V1, but only AES_GCM_V1 is supported",
			                            file_handle.GetPath());
		}
		ParquetCrypto::Read(*metadata, *file_proto, encryption_config->GetFooterKey(), encryption_util);
	} else {
		metadata->read(file_proto.get());
	}

	// Try to read the GeoParquet metadata (if present)
	auto geo_metadata = GeoParquetFileMetadata::TryRead(*metadata, context);

	return make_shared_ptr<ParquetFileMetadataCache>(std::move(metadata), current_time, std::move(geo_metadata));
}